

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Souperify.cpp
# Opt level: O0

void __thiscall
wasm::DataFlow::Trace::addPathTo
          (Trace *this,Expression *parent,Expression *curr,
          vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_> *conditions)

{
  reference ppNVar1;
  Node *local_40;
  Node *condition;
  If *pIStack_30;
  Index index;
  If *iff;
  vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_> *conditions_local;
  Expression *curr_local;
  Expression *parent_local;
  Trace *this_local;
  
  iff = (If *)conditions;
  conditions_local = (vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_> *)curr
  ;
  curr_local = parent;
  parent_local = (Expression *)this;
  pIStack_30 = Expression::dynCast<wasm::If>(parent);
  if (pIStack_30 == (If *)0x0) {
    handle_unreachable("invalid expr",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Souperify.cpp"
                       ,0x163);
  }
  if ((Expression *)conditions_local == pIStack_30->ifTrue) {
    condition._4_4_ = 0;
  }
  else {
    if ((Expression *)conditions_local != pIStack_30->ifFalse) {
      handle_unreachable("invalid expr",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Souperify.cpp"
                         ,0x15a);
    }
    condition._4_4_ = 1;
  }
  ppNVar1 = std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>::operator[]
                      (conditions,(ulong)condition._4_4_);
  local_40 = *ppNVar1;
  add(this,local_40,0);
  std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>::push_back
            (&this->pathConditions,&local_40);
  return;
}

Assistant:

void addPathTo(Expression* parent,
                 Expression* curr,
                 std::vector<Node*> conditions) {
    if (auto* iff = parent->dynCast<If>()) {
      Index index;
      if (curr == iff->ifTrue) {
        index = 0;
      } else if (curr == iff->ifFalse) {
        index = 1;
      } else {
        WASM_UNREACHABLE("invalid expr");
      }
      auto* condition = conditions[index];
      // Add the condition itself as an instruction in the trace -
      // the pc uses it as its input.
      add(condition, 0);
      // Add it as a pc, which we will emit directly.
      pathConditions.push_back(condition);
    } else {
      WASM_UNREACHABLE("invalid expr");
    }
  }